

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall
TApp_HelpFlagFromDefaultsSubcommands_Test::TestBody(TApp_HelpFlagFromDefaultsSubcommands_Test *this)

{
  bool bVar1;
  App *this_00;
  Option *pOVar2;
  char *pcVar3;
  string *lhs;
  AssertHelper local_128;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_1;
  Message local_100;
  string local_f8;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar;
  string local_c0;
  allocator local_99;
  string local_98;
  App *local_78;
  App *app2;
  string local_68;
  allocator local_31;
  string local_30;
  TApp_HelpFlagFromDefaultsSubcommands_Test *local_10;
  TApp_HelpFlagFromDefaultsSubcommands_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"--that",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"Wow",(allocator *)((long)&app2 + 7));
  CLI::App::set_help_flag(&(this->super_TApp).app,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)((long)&app2 + 7));
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"app2",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c0,"",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  this_00 = CLI::App::add_subcommand(&(this->super_TApp).app,&local_98,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  local_78 = this_00;
  pOVar2 = CLI::App::get_help_ptr(this_00);
  CLI::Option::get_name_abi_cxx11_(&local_f8,pOVar2,false);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[7]>
            ((EqHelper<false> *)local_d8,"app2->get_help_ptr()->get_name()","\"--that\"",&local_f8,
             (char (*) [7])"--that");
  std::__cxx11::string::~string((string *)&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x14a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  pOVar2 = CLI::App::get_help_ptr(local_78);
  lhs = CLI::Option::get_description_abi_cxx11_(pOVar2);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[4]>
            ((EqHelper<false> *)local_118,"app2->get_help_ptr()->get_description()","\"Wow\"",lhs,
             (char (*) [4])"Wow");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x14b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  return;
}

Assistant:

TEST_F(TApp, HelpFlagFromDefaultsSubcommands) {
    app.set_help_flag("--that", "Wow");

    auto app2 = app.add_subcommand("app2");

    EXPECT_EQ(app2->get_help_ptr()->get_name(), "--that");
    EXPECT_EQ(app2->get_help_ptr()->get_description(), "Wow");
}